

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void QGraphicsViewPrivate::translateTouchEvent(QGraphicsViewPrivate *d,QTouchEvent *touchEvent)

{
  long *plVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QPointF QVar3;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(touchEvent + 0x38) != 0) {
    uVar2 = 0;
    do {
      plVar1 = (long *)QPointerEvent::point((longlong)touchEvent);
      local_40.xp = (qreal)QEventPoint::position();
      local_40.yp = in_XMM1_Qa;
      QVar3 = mapToScene(d,&local_40);
      in_XMM1_Qa = QVar3.yp;
      *(QPointF *)(*plVar1 + 0x40) = QVar3;
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(touchEvent + 0x38));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::translateTouchEvent(QGraphicsViewPrivate *d, QTouchEvent *touchEvent)
{
    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        // the scene will set the item local pos, startPos, lastPos, and rect before delivering to
        // an item, but for now those functions are returning the view's local coordinates
        QMutableEventPoint::setScenePosition(pt, d->mapToScene(pt.position()));
        // screenPos, startScreenPos, and lastScreenPos are already set
    }
}